

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

double __thiscall kj::String::parseAs<double>(String *this)

{
  double dVar1;
  StringPtr local_10;
  
  local_10.content.size_ = (this->content).size_;
  if (local_10.content.size_ == 0) {
    local_10.content.ptr = "";
  }
  else {
    local_10.content.ptr = (this->content).ptr;
  }
  local_10.content.size_ = local_10.content.size_ + (local_10.content.size_ == 0);
  dVar1 = StringPtr::parseAs<double>(&local_10);
  return dVar1;
}

Assistant:

inline bool operator==(decltype(nullptr)) const { return size_ == 0; }